

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparseNode * __thiscall
BVSparse<Memory::JitArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::JitArenaAllocator> *this,BVIndex i,Type **prevNextFieldOut)

{
  BVSparseNode *pBVar1;
  bool bVar2;
  BVIndex BVar3;
  BVSparseNode *lastNode;
  BVSparseNode *curNode;
  Type *prevLastField;
  Type *prevNextField;
  BVIndex searchIndex;
  Type **prevNextFieldOut_local;
  BVIndex i_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  BVar3 = BVUnitT<unsigned_long>::Floor(i);
  lastNode = this->head;
  pBVar1 = this->lastFoundIndex;
  prevLastField = &this->head;
  if (lastNode == (BVSparseNode *)0x0) {
    lastNode = this->head;
  }
  else {
    if (lastNode->startIndex == BVar3) {
      *prevNextFieldOut = &this->head;
      return lastNode;
    }
    if ((pBVar1 != (BVSparseNode *)0x0) && (pBVar1->startIndex != lastNode->startIndex)) {
      if (pBVar1->startIndex == BVar3) {
        *prevNextFieldOut = &this->lastFoundIndex;
        return pBVar1;
      }
      if (pBVar1->startIndex < BVar3) {
        prevLastField = &this->lastFoundIndex;
        lastNode = this->lastFoundIndex;
      }
    }
    if (BVar3 < lastNode->startIndex) {
      lastNode = this->head;
      prevLastField = &this->head;
    }
  }
  while( true ) {
    bVar2 = false;
    if (lastNode != (BVSparseNode *)0x0) {
      bVar2 = lastNode->startIndex < BVar3;
    }
    if (!bVar2) break;
    prevLastField = &lastNode->next;
    lastNode = lastNode->next;
  }
  this->lastFoundIndex = *prevLastField;
  if ((lastNode == (BVSparseNode *)0x0) || (BVar3 != lastNode->startIndex)) {
    this_local = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    *prevNextFieldOut = prevLastField;
    this_local = (BVSparse<Memory::JitArenaAllocator> *)lastNode;
  }
  return (BVSparseNode *)this_local;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}